

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.cpp
# Opt level: O2

istream * baryonyx::operator>>(istream *is,result *ret)

{
  char cVar1;
  _Alloc_hider _Var2;
  int iVar3;
  int line;
  size_type sVar4;
  optional<int> oVar5;
  file_format_failure *pfVar6;
  char *extraout_RDX;
  size_type sVar7;
  string_view s;
  string_view str;
  string buffer;
  string_view local_40;
  
  std::make_shared<baryonyx::string_buffer>();
  std::__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2> *)ret,
             (__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2> *)&buffer);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&buffer._M_string_length);
  ret->status = success;
  std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::emplace_back<>
            (&ret->solutions);
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  line = 0;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  while (*(int *)(is + *(long *)(*(long *)is + -0x18) + 0x20) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)&buffer);
    sVar4 = buffer._M_string_length;
    _Var2 = buffer._M_dataplus;
    if ((buffer._M_string_length == 0) &&
       (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 2) != 0)) break;
    sVar7 = 0;
    do {
      if (sVar4 == sVar7) goto LAB_001adc28;
      cVar1 = _Var2._M_p[sVar7];
      iVar3 = isspace((int)cVar1);
      sVar7 = sVar7 + 1;
    } while (iVar3 != 0);
    if (cVar1 != '\\') {
LAB_001adc28:
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (&buffer,'=',0);
      _Var2 = buffer._M_dataplus;
      if (sVar4 == 0xffffffffffffffff) {
        pfVar6 = (file_format_failure *)__cxa_allocate_exception(0x40);
        file_format_failure::file_format_failure(pfVar6,bad_name,line,0);
        __cxa_throw(pfVar6,&file_format_failure::typeinfo,file_format_failure::~file_format_failure)
        ;
      }
      s._M_str = extraout_RDX;
      s._M_len = (size_t)(buffer._M_dataplus._M_p + sVar4 + 1);
      oVar5 = to_int((baryonyx *)(buffer._M_string_length - sVar4),s);
      if (((ulong)oVar5.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
        pfVar6 = (file_format_failure *)__cxa_allocate_exception(0x40);
        file_format_failure::file_format_failure(pfVar6,bad_name,line,0);
        __cxa_throw(pfVar6,&file_format_failure::typeinfo,file_format_failure::~file_format_failure)
        ;
      }
      str._M_str = _Var2._M_p;
      str._M_len = sVar4;
      local_40 = string_buffer::append
                           ((ret->strings).
                            super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,str);
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)&ret->variable_name,&local_40);
      local_40._M_len._0_1_ =
           oVar5.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _M_payload != 0;
      std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<bool>
                (&(ret->solutions).
                  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1].variables,(bool *)&local_40);
      line = line + 1;
    }
  }
  std::__cxx11::string::~string((string *)&buffer);
  return is;
}

Assistant:

std::istream&
operator>>(std::istream& is, result& ret)
{
    ret.strings = std::make_shared<baryonyx::string_buffer>();

    ret.status = result_status::success;
    ret.solutions.emplace_back();
    int line{ 0 };

    std::string buffer;
    while (is.good()) {
        std::getline(is, buffer);

        if (buffer.empty() && is.eof())
            return is;

        std::string::size_type i{ 0 };
        std::string::size_type e{ buffer.size() };

        for (; i != e; ++i)
            if (!std::isspace(buffer[i]))
                break;

        if (i != e && buffer[i] == '\\')
            continue;

        auto found = buffer.find('=', 0);
        if (found == std::string::npos)
            throw file_format_failure(
              file_format_error_tag::bad_name, line, 0);

        std::string_view left(buffer.data(), found);
        std::string_view right(buffer.data() + found + 1,
                               buffer.size() - found);

        if (auto value = to_int(right); value.has_value()) {
            ret.variable_name.emplace_back(ret.strings->append(left));
            ret.solutions.back().variables.emplace_back(!!(*value));
        } else {
            throw file_format_failure(
              file_format_error_tag::bad_name, line, 0);
        }
        ++line;
    }

    return is;
}